

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O3

void __thiscall UnitTest1::CodeGenTest::DryParserGenTest1(CodeGenTest *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __time_t _Var3;
  __suseconds_t _Var4;
  size_t sVar5;
  __node_base _Var6;
  char *in_RSI;
  long lVar7;
  ulong uVar8;
  StringLogger logger;
  Grammar<unsigned_char> grammar;
  char msg [256];
  stat st;
  DryParserEM64T<unsigned_char> parser;
  Stage1Runner runner;
  StringLogger local_748;
  Grammar<unsigned_char> local_710;
  timeval local_618 [16];
  stat local_510;
  DryParserEM64T<unsigned_char> local_480;
  Stage1Runner local_290;
  
  LoadGrammar<unsigned_char>(&local_710,in_RSI);
  for (_Var6._M_nxt = local_710.m_networks._M_h._M_before_begin._M_nxt;
      _Var6._M_nxt != (_Hash_node_base *)0x0; _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
    Centaurus::ATNMachine<unsigned_char>::drop_passthrough_nodes
              ((ATNMachine<unsigned_char> *)(_Var6._M_nxt + 6));
  }
  ::asmjit::StringLogger::StringLogger(&local_748);
  Centaurus::DryParserEM64T<unsigned_char>::DryParserEM64T
            (&local_480,&local_710,&local_748.super_Logger);
  stat("../../datasets/citylots.json",&local_510);
  Centaurus::Stage1Runner::Stage1Runner
            (&local_290,"../../datasets/citylots.json",&local_480.super_IParser,0x800000,8,false,
             false);
  gettimeofday(local_618,(__timezone_ptr_t)0x0);
  _Var4 = local_618[0].tv_usec;
  _Var3 = local_618[0].tv_sec;
  Centaurus::BaseRunner::_start<Centaurus::Stage1Runner>(&local_290.super_BaseRunner);
  pthread_join(local_290.super_BaseRunner.m_thread,(void **)0x0);
  gettimeofday(local_618,(__timezone_ptr_t)0x0);
  auVar2._8_8_ = local_618[0].tv_usec;
  auVar2._0_8_ = local_618[0].tv_sec;
  auVar1._8_8_ = _Var4;
  auVar1._0_8_ = _Var3;
  auVar1 = vpsubq_avx(auVar2,auVar1);
  lVar7 = vpextrq_avx(auVar1,1);
  uVar8 = lVar7 + auVar1._0_8_ * 1000000;
  sprintf((char *)local_618,"Elapsed time: %lu[ms]\r\n",uVar8 / 1000);
  sVar5 = strlen((char *)local_618);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_618,sVar5);
  sprintf((char *)local_618,"Throughput: %lu[MB/s]\r\n",(ulong)local_510.st_size / uVar8);
  sVar5 = strlen((char *)local_618);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_618,sVar5);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::IsTrue
            (local_290.m_result != (void *)0x0,(wchar_t *)0x0);
  Centaurus::Stage1Runner::~Stage1Runner(&local_290);
  local_480.super_IParser._vptr_IParser = (_func_int **)&PTR__DryParserEM64T_001c58e0;
  ::asmjit::CodeHolder::~CodeHolder(&local_480.m_code);
  ::asmjit::JitRuntime::~JitRuntime(&local_480.m_runtime);
  ::asmjit::StringLogger::~StringLogger(&local_748);
  Centaurus::Grammar<unsigned_char>::~Grammar(&local_710);
  return;
}

Assistant:

TEST_METHOD(DryParserGenTest1)
    {
        using namespace Centaurus;

        Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("../../grammar/json2.cgr");
        //Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("grammar/xml.cgr");

		grammar.optimize();

		/*FILE *logFile;
		fopen_s(&logFile, "parser.asm", "w");
        asmjit::FileLogger logger(logFile);*/

        asmjit::StringLogger logger;
		
        DryParserEM64T<unsigned char> parser(grammar, &logger);

        //std::cout << logger.getString() << std::endl;

		//fclose(logFile);

        //Logger::WriteMessage(logger.getString());

        //MappedFileInput json("/home/ihara/Downloads/sf-city-lots-json-master/citylots.json");

#if defined(CENTAURUS_BUILD_WINDOWS)
		const char *input_path = "..\\..\\datasets\\citylots.json";
		//const char *input_path = "test2.json";
#elif defined(CENTAURUS_BUILD_LINUX)
        const char *input_path = "../../datasets/citylots.json";
#endif
        struct stat st;
        stat(input_path, &st);

        Stage1Runner runner{input_path, &parser, 8 * 1024 * 1024, 8};

		uint64_t start_time = get_us_clock();

        runner.start();
        runner.wait();

		uint64_t end_time = get_us_clock();

		char msg[256];
		sprintf(msg, "Elapsed time: %lu[ms]\r\n", (end_time - start_time) / 1000);
		Logger::WriteMessage(msg);

        sprintf(msg, "Throughput: %lu[MB/s]\r\n", st.st_size / (end_time - start_time));
        Logger::WriteMessage(msg);

        //Assert::AreEqual((const void *)(json + strlen(json)), context.result);
        Assert::IsTrue(runner.get_result() != NULL);

        //_aligned_free(json);
    }